

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O0

void Omega_h::mark_dead_ents
               (Mesh *mesh,LOs *rails2edges,Read<signed_char> *rail_col_dirs,Int cell_dim,
               Write<signed_char> *dead_cells,Write<signed_char> *dead_sides)

{
  void **__return_storage_ptr__;
  undefined4 local_1e8;
  undefined4 local_1d8;
  undefined4 local_1cc;
  undefined4 local_1c4;
  undefined1 local_1a8 [8];
  type f;
  LO nrails;
  Int nccs;
  Read<int> local_100 [2];
  undefined1 local_e0 [8];
  LOs cs2s;
  Read<signed_char> ec_codes;
  LOs ec2c;
  undefined1 local_a0 [8];
  LOs e2ec;
  Adj e2c;
  Write<signed_char> *dead_sides_local;
  Write<signed_char> *dead_cells_local;
  Int cell_dim_local;
  Read<signed_char> *rail_col_dirs_local;
  LOs *rails2edges_local;
  Mesh *mesh_local;
  ulong local_10;
  
  __return_storage_ptr__ = &e2ec.write_.shared_alloc_.direct_ptr;
  e2c.codes.write_.shared_alloc_.direct_ptr = dead_sides;
  Mesh::ask_up((Adj *)__return_storage_ptr__,mesh,1,cell_dim);
  Read<int>::Read((Read<int> *)local_a0,(Read<int> *)__return_storage_ptr__);
  Read<int>::Read((Read<int> *)&ec_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&e2c.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&cs2s.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&e2c.super_Graph.ab2b.write_.shared_alloc_.direct_ptr);
  Mesh::ask_down((Adj *)&nrails,mesh,cell_dim,cell_dim + -1);
  Read<int>::Read((Read<int> *)local_e0,local_100);
  Adj::~Adj((Adj *)&nrails);
  if (cell_dim == 0) {
    local_1c4 = 1;
  }
  else {
    if (cell_dim == 1) {
      local_1cc = 2;
    }
    else {
      if (cell_dim == 2) {
        local_1d8 = 3;
      }
      else {
        if (cell_dim == 3) {
          local_1e8 = 4;
        }
        else {
          local_1e8 = 0xffffffff;
        }
        local_1d8 = local_1e8;
      }
      local_1cc = local_1d8;
    }
    local_1c4 = local_1cc;
  }
  f.dead_sides.shared_alloc_.direct_ptr._4_4_ = local_1c4;
  if (((ulong)(rails2edges->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((rails2edges->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(rails2edges->write_).shared_alloc_.alloc >> 3;
  }
  f.dead_sides.shared_alloc_.direct_ptr._0_4_ = (LO)(local_10 >> 2);
  Read<int>::Read((Read<int> *)local_1a8,rails2edges);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.rails2edges.write_.shared_alloc_.direct_ptr,rail_col_dirs);
  Read<int>::Read((Read<int> *)&f.rail_col_dirs.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_a0);
  Read<int>::Read((Read<int> *)&f.e2ec.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&ec_codes.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.ec2c.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&cs2s.write_.shared_alloc_.direct_ptr);
  f.ec_codes.write_.shared_alloc_.direct_ptr._0_4_ = cell_dim;
  Read<int>::Read((Read<int> *)&f.cell_dim,(Read<int> *)local_e0);
  f.cs2s.write_.shared_alloc_.direct_ptr._0_4_ = f.dead_sides.shared_alloc_.direct_ptr._4_4_;
  Write<signed_char>::Write((Write<signed_char> *)&f.nccs,dead_cells);
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.dead_cells.shared_alloc_.direct_ptr,
             (Write<signed_char> *)e2c.codes.write_.shared_alloc_.direct_ptr);
  parallel_for<Omega_h::mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)::__0>
            ((LO)f.dead_sides.shared_alloc_.direct_ptr,(type *)local_1a8,"mark_dead_ents");
  mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)
  ::$_0::~__0((__0 *)local_1a8);
  Read<int>::~Read((Read<int> *)local_e0);
  Read<signed_char>::~Read((Read<signed_char> *)&cs2s.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&ec_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_a0);
  Adj::~Adj((Adj *)&e2ec.write_.shared_alloc_.direct_ptr);
  return;
}

Assistant:

void mark_dead_ents(Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs,
    Int cell_dim, Write<I8>& dead_cells, Write<I8>& dead_sides) {
  auto e2c = mesh->ask_up(EDGE, cell_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto cs2s = mesh->ask_down(cell_dim, cell_dim - 1).ab2b;
  auto nccs = simplex_degree(cell_dim, cell_dim - 1);
  auto nrails = rails2edges.size();
  auto f = OMEGA_H_LAMBDA(LO rail) {
    auto e = rails2edges[rail];
    auto eev_col = rail_col_dirs[rail];
    auto eev_onto = 1 - eev_col;
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto ec_code = ec_codes[ec];
      auto cce = code_which_down(ec_code);
      auto rot = code_rotation(ec_code);
      auto cev_onto = rot ^ eev_onto;
      auto ccv_onto = simplex_down_template(cell_dim, EDGE, cce, cev_onto);
      auto ccs_opp = simplex_opposite_template(cell_dim, VERT, ccv_onto);
      auto s_opp = cs2s[c * nccs + ccs_opp];
      dead_cells[c] = 1;
      dead_sides[s_opp] = 1;
    }
  };
  parallel_for(nrails, f, "mark_dead_ents");
}